

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertion_tests.cpp
# Opt level: O2

void same_stl_string_references_are_equal(void)

{
  Constraint_ *pCVar1;
  allocator local_31;
  string bob;
  
  std::__cxx11::string::string((string *)&bob,"bob",&local_31);
  pCVar1 = (Constraint_ *)cgreen::create_equal_to_string_constraint((string *)&bob,"bob");
  cgreen::assert_that_
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/cpp_assertion_tests.cpp"
             ,0x43,"bob",(string *)&bob,pCVar1);
  std::__cxx11::string::~string((string *)&bob);
  return;
}

Assistant:

Ensure(same_stl_string_references_are_equal) {
    std::string bob("bob");
    assert_that(bob, is_equal_to_string(bob));
}